

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mcu8str_assign(mcu8str *dest,mcu8str *src)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  mcu8str local_30;
  
  uVar4 = src->size + 1;
  if (dest->buflen < uVar4) {
    mcu8str_create(&local_30,(ulong)src->size);
    mcu8str_assign(&local_30,src);
    pcVar2 = dest->c_str;
    iVar1 = dest->owns_memory;
    dest->c_str = local_30.c_str;
    dest->owns_memory = local_30.owns_memory;
    uVar3._0_4_ = dest->size;
    uVar3._4_4_ = dest->buflen;
    dest->size = local_30.size;
    dest->buflen = local_30.buflen;
    local_30.c_str = pcVar2;
    local_30._8_8_ = uVar3;
    local_30.owns_memory = iVar1;
    mcu8str_dealloc(&local_30);
  }
  else {
    memmove(dest->c_str,src->c_str,(ulong)uVar4);
    dest->size = src->size;
  }
  return;
}

Assistant:

void mcu8str_assign( mcu8str* dest, const mcu8str* src )
  {
    if ( src->size +1 <= dest->buflen ) {
      //Already fits. Using memmove in case of self assignment:
      STDNS memmove( dest->c_str, src->c_str, src->size + 1 );
      dest->size = src->size;
      return;
    }
    mcu8str newstr = mcu8str_create( src->size );
    mcu8str_assign( &newstr, src );
    mcu8str_swap( dest, &newstr );
    mcu8str_dealloc( &newstr );
  }